

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_christmas_event.hpp
# Opt level: O0

void __thiscall PatchChristmasEvent::load_from_rom(PatchChristmasEvent *this,ROM *rom)

{
  uint8_t *it;
  Sprite local_90;
  undefined4 local_5c;
  uint32_t MONEYBAG_SPRITE_ADDR;
  ROM *local_18;
  ROM *rom_local;
  PatchChristmasEvent *this_local;
  
  local_18 = rom;
  rom_local = (ROM *)this;
  ColorPalette<16UL>::from_rom((ColorPalette<16UL> *)&stack0xffffffffffffffa8,rom,0x3deca);
  memcpy(&this->_title_palette,&stack0xffffffffffffffa8,0x40);
  local_5c = 0x151cc4;
  it = md::ROM::iterator_at(local_18,0x151cc4);
  Sprite::decode_from(&local_90,it);
  Sprite::operator=(&this->_moneybag_sprite,&local_90);
  Sprite::~Sprite(&local_90);
  return;
}

Assistant:

void load_from_rom(const md::ROM& rom) override
    {
        _title_palette = ColorPalette<16>::from_rom(rom, 0x3DECA);

        constexpr uint32_t MONEYBAG_SPRITE_ADDR = 0x151CC4;
        _moneybag_sprite = Sprite::decode_from(rom.iterator_at(MONEYBAG_SPRITE_ADDR));
    }